

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTportWeight.c
# Opt level: O2

u_int sbfTport_topicWeight(sbfTport tport,sbfTopic topic)

{
  sbfTportWeight *psVar1;
  long lVar2;
  int iVar3;
  char *__string;
  ulong uVar4;
  long lVar5;
  
  uVar4 = 0xffffffffffffffff;
  lVar2 = 8;
  do {
    lVar5 = lVar2;
    uVar4 = uVar4 + 1;
    if (tport->mWeightsListSize <= uVar4) {
      return 1;
    }
    psVar1 = tport->mWeightsList;
    __string = sbfTopic_getTopic(topic);
    iVar3 = regexec((regex_t *)((long)&psVar1->mWeight + lVar5),__string,0,(regmatch_t *)0x0,0);
    lVar2 = lVar5 + 0x48;
  } while (iVar3 != 0);
  return *(u_int *)(&psVar1[-1].mPattern.field_0x38 + lVar5);
}

Assistant:

u_int
sbfTport_topicWeight (sbfTport tport, sbfTopic topic)
{
    sbfTportWeight* w;
    u_int           i;

    for (i = 0; i < tport->mWeightsListSize; i++)
    {
        w = &tport->mWeightsList[i];
        if (regexec (&w->mPattern, sbfTopic_getTopic (topic), 0, NULL, 0) == 0)
            return w->mWeight;
    }
    return 1;
}